

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  RawSchema *this_00;
  bool bVar1;
  unsigned_long *puVar2;
  uint64_t id;
  MethodList *in_R9;
  Range<unsigned_long> RVar3;
  StringPtr name_00;
  Schema local_228;
  Schema local_220;
  Maybe<capnp::InterfaceSchema::Method> local_218;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Reader local_138;
  undefined1 local_108 [8];
  Reader superclasses;
  MethodList local_d0;
  RawSchema *local_98;
  char *pcStack_90;
  undefined1 local_7d;
  Fault local_68;
  Fault f;
  undefined1 local_58 [8];
  DebugComparison<unsigned_int,_const_unsigned_int_&> _kjCondition;
  uint *counter_local;
  InterfaceSchema *this_local;
  StringPtr name_local;
  Maybe<capnp::InterfaceSchema::Method> *result;
  
  f.exception._0_4_ = *counter;
  *counter = (uint)f.exception + 1;
  _kjCondition._32_8_ = counter;
  f.exception._4_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&f);
  kj::_::DebugExpression<unsigned_int>::operator<
            ((DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_58,
             (DebugExpression<unsigned_int> *)((long)&f.exception + 4),&MAX_SUPERCLASSES);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (bVar1) {
    local_7d = 0;
    this_00 = ((this->super_Schema).raw)->generic;
    local_98 = (RawSchema *)name.content.ptr;
    pcStack_90 = (char *)name.content.size_;
    getMethods(&local_d0,this);
    name_00.content.size_ = (size_t)&local_d0;
    name_00.content.ptr = pcStack_90;
    anon_unknown_34::findSchemaMemberByName<capnp::InterfaceSchema::MethodList>
              (__return_storage_ptr__,(anon_unknown_34 *)this_00,local_98,name_00,in_R9);
    bVar1 = kj::Maybe<capnp::InterfaceSchema::Method>::operator==(__return_storage_ptr__);
    if (bVar1) {
      Schema::getProto((Reader *)&__range2,&this->super_Schema);
      capnp::schema::Node::Reader::getInterface(&local_138,(Reader *)&__range2);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_108,&local_138);
      RVar3 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                        ((Reader *)local_108);
      __begin2.value = RVar3.begin_;
      __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
      while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
        superclass._reader._40_8_ = *puVar2;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_1c8,(Reader *)local_108,superclass._reader.nestingLimit);
        local_1cc = _::RawBrandedSchema::makeDepLocation(SUPERCLASS,superclass._reader.nestingLimit)
        ;
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_1c8);
        local_228 = Schema::getDependency(&this->super_Schema,id,local_1cc);
        local_220.raw = (RawBrandedSchema *)Schema::asInterface(&local_228);
        findMethodByName(&local_218,(InterfaceSchema *)&local_220,name,(uint *)_kjCondition._32_8_);
        kj::Maybe<capnp::InterfaceSchema::Method>::operator=(__return_storage_ptr__,&local_218);
        kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_218);
        bVar1 = kj::Maybe<capnp::InterfaceSchema::Method>::operator==(__return_storage_ptr__);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return __return_storage_ptr__;
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end2);
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x24a,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)local_58,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == kj::none) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != kj::none) {
        break;
      }
    }
  }

  return result;
}